

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

int gmlc::utilities::numeric_conversionComplete<int>(string_view V,int defValue)

{
  utilities *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t *in_RCX;
  undefined4 in_register_00000014;
  int iVar5;
  utilities *this;
  string_view V_00;
  string_view input;
  size_t rem;
  utilities *local_30;
  
  V_00._M_str._4_4_ = in_register_00000014;
  V_00._M_str._0_4_ = defValue;
  V_00._M_len = V._M_str;
  this = (utilities *)V._M_len;
  bVar2 = nonNumericFirstOrLastCharacter(this,V_00);
  iVar5 = defValue;
  if (!bVar2) {
    input._M_str = (char *)&local_30;
    input._M_len = (size_t)V_00._M_len;
    iVar3 = strViewToInteger<int>(this,input,in_RCX);
    while ((puVar1 = local_30, iVar5 = iVar3, local_30 < this &&
           (iVar4 = isspace((int)V_00._M_len[(long)local_30]), iVar5 = defValue, iVar4 != 0))) {
      local_30 = puVar1 + 1;
    }
  }
  return iVar5;
}

Assistant:

X numeric_conversionComplete(std::string_view V, const X defValue)
{
    if (nonNumericFirstOrLastCharacter(V)) {
        return defValue;
    }
    try {
        size_t rem;
        X res = numConvComp<X>(V, rem);
        while (rem < V.length()) {
            if (!(isspace(V[rem]))) {
                res = defValue;
                break;
            }
            ++rem;
        }
        return res;
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}